

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateCode
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  Parser *pPVar1;
  bool bVar2;
  int iVar3;
  pointer __dest;
  Status SVar4;
  byte *pbVar5;
  byte *pbVar6;
  string cpp_std;
  IDLOptionsCpp opts;
  CppGenerator generator;
  size_type __dnew;
  byte *local_ce8;
  long local_ce0;
  undefined4 local_cd8;
  undefined1 uStack_cd4;
  byte bStack_cd3;
  undefined2 uStack_cd2;
  IDLOptions local_cc8;
  byte local_9b8;
  undefined1 local_9b0 [1640];
  Parser *local_348 [98];
  bool local_38;
  
  IDLOptions::IDLOptions(&local_cc8,&parser->opts);
  local_cc8._780_4_ = 1;
  local_9b8 = 1;
  local_ce8 = (byte *)&local_cd8;
  if (local_cc8.cpp_std._M_string_length == 0) {
    uStack_cd4 = 0x31;
    local_cd8 = 0x312b2b43;
    pbVar6 = &bStack_cd3;
    local_ce0 = 5;
    bStack_cd3 = 0;
    pbVar5 = (byte *)&local_cd8;
LAB_0015faa3:
    do {
      iVar3 = toupper((uint)*pbVar5);
      *pbVar5 = (byte)iVar3;
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar6);
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ce8,local_cc8.cpp_std._M_dataplus._M_p,
               local_cc8.cpp_std._M_dataplus._M_p + local_cc8.cpp_std._M_string_length);
    if (local_ce0 != 0) {
      pbVar6 = local_ce8 + local_ce0;
      pbVar5 = local_ce8;
      goto LAB_0015faa3;
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_ce8);
  if (iVar3 == 0) {
    local_cc8._780_4_ = 0;
    local_9b8 = 0;
LAB_0015fb44:
    local_9b8 = local_9b8 | local_cc8.scoped_enums;
    if (local_cc8.cpp_static_reflection != true) {
LAB_0015fc0e:
      IDLOptions::IDLOptions((IDLOptions *)local_348,&local_cc8);
      local_38 = (bool)local_9b8;
      local_348[0x61]._4_4_ = local_cc8._780_4_;
      cpp::CppGenerator::CppGenerator
                ((CppGenerator *)local_9b0,parser,path,filename,(IDLOptionsCpp *)local_348);
      IDLOptions::~IDLOptions((IDLOptions *)local_348);
      bVar2 = cpp::CppGenerator::generate((CppGenerator *)local_9b0);
      cpp::CppGenerator::~CppGenerator((CppGenerator *)local_9b0);
      SVar4 = (Status)!bVar2;
      goto LAB_0015fc88;
    }
    local_348[0] = (Parser *)0x46;
    local_9b0._0_8_ = local_9b0 + 0x10;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)local_9b0,(ulong)local_348);
    pPVar1 = local_348[0];
    local_9b0._16_8_ = local_348[0];
    local_9b0._0_8_ = __dest;
    memcpy(__dest,"--cpp-static-reflection requires using --cpp-std at \"C++17\" or higher.",0x46);
    local_9b0._8_8_ = pPVar1;
    __dest[(long)pPVar1] = '\0';
    LogCompilerError((string *)local_9b0);
    if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) {
LAB_0015fbda:
      operator_delete((void *)local_9b0._0_8_,local_9b0._16_8_ + 1);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_ce8);
    if (iVar3 == 0) {
      local_9b8 = 1;
      local_cc8._780_4_ = 1;
      goto LAB_0015fb44;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_ce8);
    if (iVar3 == 0) {
      local_cc8._780_4_ = 2;
      local_cc8.prefixed_enums = false;
      local_cc8.scoped_enums = true;
      local_9b8 = 1;
      goto LAB_0015fc0e;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b0,
                   "Unknown value of the \'--cpp-std\' switch: ",&local_cc8.cpp_std);
    LogCompilerError((string *)local_9b0);
    if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) goto LAB_0015fbda;
  }
  SVar4 = ERROR;
LAB_0015fc88:
  if (local_ce8 != (byte *)&local_cd8) {
    operator_delete(local_ce8,
                    CONCAT26(uStack_cd2,CONCAT15(bStack_cd3,CONCAT14(uStack_cd4,local_cd8))) + 1);
  }
  IDLOptions::~IDLOptions(&local_cc8);
  return SVar4;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }